

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

void QMakeEvaluator::initFunctionStatics(void)

{
  long lVar1;
  long in_FS_OFFSET;
  uint i_1;
  uint i;
  piter in_stack_ffffffffffffff18;
  undefined4 local_d4;
  piter in_stack_ffffffffffffff30;
  QMakeBuiltinInit *d;
  undefined4 in_stack_ffffffffffffff40;
  uint uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<ProKey,_QMakeInternal::QMakeBuiltin>::reserve
            ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)in_stack_ffffffffffffff18.bucket,
             (qsizetype)in_stack_ffffffffffffff18.d);
  for (uVar2 = 0; d = (QMakeBuiltinInit *)in_stack_ffffffffffffff30.bucket, uVar2 < 0x30;
      uVar2 = uVar2 + 1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffff18.bucket,(char *)in_stack_ffffffffffffff18.d);
    QMakeInternal::QMakeBuiltin::QMakeBuiltin
              ((QMakeBuiltin *)CONCAT44(uVar2,in_stack_ffffffffffffff40),d);
    in_stack_ffffffffffffff30 =
         (piter)QHash<ProKey,_QMakeInternal::QMakeBuiltin>::insert
                          ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)
                           in_stack_ffffffffffffff18.bucket,(ProKey *)in_stack_ffffffffffffff18.d,
                           (QMakeBuiltin *)0x2c57fa);
    QMakeInternal::QMakeBuiltin::~QMakeBuiltin((QMakeBuiltin *)0x2c5811);
    ProKey::~ProKey((ProKey *)0x2c581b);
  }
  QHash<ProKey,_QMakeInternal::QMakeBuiltin>::reserve
            ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)in_stack_ffffffffffffff18.bucket,
             (qsizetype)in_stack_ffffffffffffff18.d);
  for (local_d4 = 0; local_d4 < 0x23; local_d4 = local_d4 + 1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffff18.bucket,(char *)in_stack_ffffffffffffff18.d);
    QMakeInternal::QMakeBuiltin::QMakeBuiltin
              ((QMakeBuiltin *)CONCAT44(uVar2,in_stack_ffffffffffffff40),
               (QMakeBuiltinInit *)in_stack_ffffffffffffff30.bucket);
    in_stack_ffffffffffffff18 =
         (piter)QHash<ProKey,_QMakeInternal::QMakeBuiltin>::insert
                          ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)
                           in_stack_ffffffffffffff18.bucket,(ProKey *)in_stack_ffffffffffffff18.d,
                           (QMakeBuiltin *)0x2c58b9);
    QMakeInternal::QMakeBuiltin::~QMakeBuiltin((QMakeBuiltin *)0x2c58cf);
    ProKey::~ProKey((ProKey *)0x2c58d9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::initFunctionStatics()
{
    static const QMakeBuiltinInit expandInits[] = {
        { "member", E_MEMBER, 1, 3, "var, [start, [end]]" },
        { "str_member", E_STR_MEMBER, -1, 3, "str, [start, [end]]" },
        { "first", E_FIRST, 1, 1, "var" },
        { "take_first", E_TAKE_FIRST, 1, 1, "var" },
        { "last", E_LAST, 1, 1, "var" },
        { "take_last", E_TAKE_LAST, 1, 1, "var" },
        { "size", E_SIZE, 1, 1, "var" },
        { "str_size", E_STR_SIZE, -1, 1, "str" },
        { "cat", E_CAT, 1, 2, "file, [mode=true|blob|lines]" },
        { "fromfile", E_FROMFILE, 2, 2, "file, var" },
        { "eval", E_EVAL, 1, 1, "var" },
        { "list", E_LIST, 0, QMakeBuiltinInit::VarArgs, nullptr },
        { "sprintf", E_SPRINTF, 1, QMakeBuiltinInit::VarArgs, "format, ..." },
        { "format_number", E_FORMAT_NUMBER, 1, 2, "number, [options...]" },
        { "num_add", E_NUM_ADD, 1, QMakeBuiltinInit::VarArgs, "num, ..." },
        { "join", E_JOIN, 1, 4, "var, [glue, [before, [after]]]" },
        { "split", E_SPLIT, 1, 2, "var, sep" },
        { "basename", E_BASENAME, 1, 1, "var" },
        { "dirname", E_DIRNAME, 1, 1, "var" },
        { "section", E_SECTION, 3, 4, "var, sep, begin, [end]" },
        { "find", E_FIND, 2, 2, "var, str" },
        { "system", E_SYSTEM, 1, 3, "command, [mode], [stsvar]" },
        { "unique", E_UNIQUE, 1, 1, "var" },
        { "sorted", E_SORTED, 1, 1, "var" },
        { "reverse", E_REVERSE, 1, 1, "var" },
        { "quote", E_QUOTE, 0, QMakeBuiltinInit::VarArgs, nullptr },
        { "escape_expand", E_ESCAPE_EXPAND, 0, QMakeBuiltinInit::VarArgs, nullptr },
        { "upper", E_UPPER, 0, QMakeBuiltinInit::VarArgs, nullptr },
        { "lower", E_LOWER, 0, QMakeBuiltinInit::VarArgs, nullptr },
        { "title", E_TITLE, 0, QMakeBuiltinInit::VarArgs, nullptr },
        { "re_escape", E_RE_ESCAPE, 0, QMakeBuiltinInit::VarArgs, nullptr },
        { "val_escape", E_VAL_ESCAPE, 1, 1, "var" },
        { "files", E_FILES, 1, 2, "pattern, [recursive=false]" },
        { "prompt", E_PROMPT, 1, 2, "question, [decorate=true]" },
        { "replace", E_REPLACE, 3, 3, "var, before, after" },
        { "sort_depends", E_SORT_DEPENDS, 1, 4, "var, [prefix, [suffixes, [prio-suffix]]]" },
        { "resolve_depends", E_RESOLVE_DEPENDS, 1, 4, "var, [prefix, [suffixes, [prio-suffix]]]" },
        { "enumerate_vars", E_ENUMERATE_VARS, 0, 0, "" },
        { "shadowed", E_SHADOWED, 1, 1, "path" },
        { "absolute_path", E_ABSOLUTE_PATH, -1, 2, "path, [base]" },
        { "relative_path", E_RELATIVE_PATH, -1, 2, "path, [base]" },
        { "clean_path", E_CLEAN_PATH, -1, 1, "path" },
        { "system_path", E_SYSTEM_PATH, -1, 1, "path" },
        { "shell_path", E_SHELL_PATH, -1, 1, "path" },
        { "system_quote", E_SYSTEM_QUOTE, -1, 1, "arg" },
        { "shell_quote", E_SHELL_QUOTE, -1, 1, "arg" },
        { "getenv", E_GETENV, 1, 1, "arg" },
        { "read_registry", E_READ_REGISTRY, 2, 3, "tree, key, [wow64]" },
    };
    statics.expands.reserve((int)(sizeof(expandInits)/sizeof(expandInits[0])));
    for (unsigned i = 0; i < sizeof(expandInits)/sizeof(expandInits[0]); ++i)
        statics.expands.insert(ProKey(expandInits[i].name), QMakeBuiltin(expandInits[i]));

    static const QMakeBuiltinInit testInits[] = {
        { "requires", T_REQUIRES, 0, QMakeBuiltinInit::VarArgs, nullptr },
        { "greaterThan", T_GREATERTHAN, 2, 2, "var, val" },
        { "lessThan", T_LESSTHAN, 2, 2, "var, val" },
        { "equals", T_EQUALS, 2, 2, "var, val" },
        { "isEqual", T_EQUALS, 2, 2, "var, val" },
        { "versionAtLeast", T_VERSION_AT_LEAST, 2, 2, "var, version" },
        { "versionAtMost", T_VERSION_AT_MOST, 2, 2, "var, version" },
        { "exists", T_EXISTS, 1, 1, "file" },
        { "export", T_EXPORT, 1, 1, "var" },
        { "clear", T_CLEAR, 1, 1, "var" },
        { "unset", T_UNSET, 1, 1, "var" },
        { "eval", T_EVAL, 0, QMakeBuiltinInit::VarArgs, nullptr },
        { "CONFIG", T_CONFIG, 1, 2, "config, [mutuals]" },
        { "if", T_IF, 1, 1, "condition" },
        { "isActiveConfig", T_CONFIG, 1, 2, "config, [mutuals]" },
        { "system", T_SYSTEM, 1, 1, "exec" },
        { "discard_from", T_DISCARD_FROM, 1, 1, "file" },
        { "defined", T_DEFINED, 1, 2, "object, [\"test\"|\"replace\"|\"var\"]" },
        { "contains", T_CONTAINS, 2, 3, "var, val, [mutuals]" },
        { "infile", T_INFILE, 2, 3, "file, var, [values]" },
        { "count", T_COUNT, 2, 3, "var, count, [op=operator]" },
        { "isEmpty", T_ISEMPTY, 1, 1, "var" },
        { "parseJson", T_PARSE_JSON, 2, 2, "var, into" },
        { "load", T_LOAD, 1, 2, "feature, [ignore_errors=false]" },
        { "include", T_INCLUDE, 1, 3, "file, [into, [silent]]" },
        { "debug", T_DEBUG, 2, 2, "level, message" },
        { "log", T_LOG, 1, 1, "message" },
        { "message", T_MESSAGE, 1, 1, "message" },
        { "warning", T_WARNING, 1, 1, "message" },
        { "error", T_ERROR, 0, 1, "message" },
        { "mkpath", T_MKPATH, 1, 1, "path" },
        { "write_file", T_WRITE_FILE, 1, 3, "name, [content var, [append] [exe]]" },
        { "touch", T_TOUCH, 2, 2, "file, reffile" },
        { "cache", T_CACHE, 0, 3, "[var], [set|add|sub] [transient] [super|stash], [srcvar]" },
        { "reload_properties", T_RELOAD_PROPERTIES, 0, 0, "" },
    };
    statics.functions.reserve((int)(sizeof(testInits)/sizeof(testInits[0])));
    for (unsigned i = 0; i < sizeof(testInits)/sizeof(testInits[0]); ++i)
        statics.functions.insert(ProKey(testInits[i].name), QMakeBuiltin(testInits[i]));
}